

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O2

uint __thiscall BTree<NodeBTree,_NodeKey>::searchByKey(BTree<NodeBTree,_NodeKey> *this,NodeKey *key)

{
  byte bVar1;
  uint *puVar2;
  uint64_t uVar3;
  uint8_t *data;
  byte *data_00;
  uint uVar4;
  KeyCompareOp in_R9;
  bool bVar5;
  SearchResult result;
  byte *local_38;
  
  puVar2 = (uint *)this->m_data;
  uVar4 = *puVar2;
  bVar1 = (byte)*puVar2;
  result.lowerBound = 0;
  result.upperBound = 0;
  result.index = 0xffffffff;
  result.maxIndex = 0;
  data_00 = (byte *)((long)puVar2 +
                    (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8));
  uVar4 = (uint)bVar1;
  do {
    bVar5 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar5) {
      data = searchWithComparison(this,&result,data_00,0,key,in_R9);
LAB_0011cf09:
      if (bVar1 == 0) {
        result._0_8_ = result._0_8_ & 0xffffffff;
      }
      if (data == (uint8_t *)0x0) {
        uVar4 = 0xffffffff;
      }
      else {
        uVar4 = (result.maxIndex - result.upperBound) + result.lowerBound;
        NodeBTree::parseData((NodeBTree *)this,key,data);
      }
      return uVar4;
    }
    local_38 = searchWithComparison(this,&result,data_00,(uint)bVar1,key,in_R9);
    if (local_38 == (byte *)0x0) {
      data = (uint8_t *)0x0;
      local_38 = (byte *)0x0;
      goto LAB_0011cf09;
    }
    uVar3 = decodeBitsAndAdvance(&local_38);
    result.maxIndex = (uint)uVar3;
    uVar3 = decodeBitsAndAdvance(&local_38);
    data_00 = this->m_data + (uVar3 & 0xffffffff);
    local_38 = data_00;
  } while( true );
}

Assistant:

unsigned int searchByKey(Key& key) const
	{
		const auto& self = static_cast<const Derived&>(*this);
		
		const auto count = static_cast<unsigned int>(readAtWithByteSwap<uint8_t>(m_data, 0));
		const auto offset = readAtWithByteSwap<uint32_t>(m_data, 0) & UINT32_C(0xFFFFFF);
		
		auto data = advancePointer(m_data, offset);
		SearchResult result;
		for (auto i = count; i != 0; i--) {
			data = searchWithComparison(result, data, count, key, &Derived::lessThanKeyCompareOp);
			if (!data)
				goto done;
			
			result.maxIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			
			data = self.advanceData(data);
			
			const auto nextOffset = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			data = advancePointer(m_data, nextOffset);
		}
		
		data = searchWithComparison(result, data, 0, key, &Derived::equalKeyCompareOp);

	done:
		if (count == 0)
			result.upperBound = 0;
			
		if (data) {
			const auto index = (result.maxIndex - result.upperBound + result.lowerBound);
			self.parseData(key, data);
			return index;
		} else {
			return INVALID_INDEX;
		}
	}